

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O2

void monster_group_assign(chunk_conflict *c,monster *mon,monster_group_info *info,_Bool loading)

{
  wchar_t wVar1;
  mon_group_list_entry *p;
  monster_group *pmVar2;
  undefined7 in_register_00000009;
  long lVar3;
  long lVar4;
  
  if ((int)CONCAT71(in_register_00000009,loading) == 0) {
    if (c->monster_groups[info->index] != (monster_group *)0x0) {
      monster_add_to_group(c,mon,c->monster_groups[info->index]);
      return;
    }
    monster_group_start(c,mon,L'\0');
    return;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 2) {
      return;
    }
    p = (mon_group_list_entry *)mem_zalloc(0x10);
    wVar1 = info[lVar4].index;
    lVar3 = (long)wVar1;
    if (lVar3 == 0) {
      if (lVar4 != 0) {
        mem_free(p);
        return;
      }
      quit_fmt("Monster %d has no group",(ulong)(uint)mon->midx);
    }
    pmVar2 = c->monster_groups[lVar3];
    if (pmVar2 == (monster_group *)0x0) {
      pmVar2 = monster_group_new();
      pmVar2->index = wVar1;
      c->monster_groups[lVar3] = pmVar2;
    }
    wVar1 = mon->midx;
    if (info[lVar4].role == MON_GROUP_LEADER) {
      pmVar2->leader = wVar1;
    }
    p->midx = wVar1;
    p->next = pmVar2->member_list;
    pmVar2->member_list = p;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void monster_group_assign(struct chunk *c, struct monster *mon,
						  struct monster_group_info *info, bool loading)
{
	int index = info[PRIMARY_GROUP].index;
	struct monster_group *group = monster_group_by_index(c, index);

	if (!loading) {
		/* For newly created monsters, use the group start and add functions */
		if (group) {
			monster_add_to_group(c, mon, group);
		} else {
			monster_group_start(c, mon, 0);
		}
	} else {
		/* For loading from a savefile, build by hand */
		int i;

		for (i = 0; i < GROUP_MAX; i++) {
			struct mon_group_list_entry *entry = mem_zalloc(sizeof(*entry));

			/* Check the index */
			index = info[i].index;
			if (!index) {
				if (i == PRIMARY_GROUP) {
					/* Everything should have a primary group */
					quit_fmt("Monster %d has no group", mon->midx);
				} else {
					/* Plenty of things have no summon group */
					mem_free(entry);
					return;
				}
			}

			/* Fill out the group, creating if necessary */
			group = monster_group_by_index(c, index);
			if (!group) {
				group = monster_group_new();
				group->index = index;
				c->monster_groups[index] = group;
			}
			if (info[i].role == MON_GROUP_LEADER) {
				group->leader = mon->midx;
			}

			/* Add this monster */
			entry->midx = mon->midx;
			entry->next = group->member_list;
			group->member_list = entry;
		}
	}
}